

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.h
# Opt level: O0

void dbgprintf(char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char buf [8192];
  undefined1 local_20d8 [8];
  undefined8 local_20d0;
  undefined8 local_20c8;
  undefined8 local_20c0;
  undefined8 local_20b8;
  undefined8 local_20b0;
  undefined8 local_20a8;
  undefined8 local_2098;
  undefined8 local_2088;
  undefined8 local_2078;
  undefined8 local_2068;
  undefined8 local_2058;
  undefined8 local_2048;
  undefined8 local_2038;
  undefined4 local_2028;
  undefined4 local_2024;
  undefined1 *local_2020;
  undefined1 *local_2018;
  char local_2008 [8192];
  char *local_8;
  
  if (in_AL != '\0') {
    local_20a8 = in_XMM0_Qa;
    local_2098 = in_XMM1_Qa;
    local_2088 = in_XMM2_Qa;
    local_2078 = in_XMM3_Qa;
    local_2068 = in_XMM4_Qa;
    local_2058 = in_XMM5_Qa;
    local_2048 = in_XMM6_Qa;
    local_2038 = in_XMM7_Qa;
  }
  local_2018 = local_20d8;
  local_2020 = &stack0x00000008;
  local_2024 = 0x30;
  local_2028 = 8;
  local_20d0 = in_RSI;
  local_20c8 = in_RDX;
  local_20c0 = in_RCX;
  local_20b8 = in_R8;
  local_20b0 = in_R9;
  local_8 = in_RDI;
  vsprintf(local_2008,in_RDI,&local_2028);
  fprintf(_stderr,"%s",local_2008);
  return;
}

Assistant:

inline void dbgprintf(const char *format, ...) {
#ifdef DEBUG
  char buf[BUFSIZ];
  va_list args;
  va_start(args, format);
  vsprintf(buf, format, args);
  fprintf(stderr, "%s", buf);
  va_end(args);
#endif
}